

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_test_impossible_marks(REF_SUBDIV ref_subdiv)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell_00;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL possible;
  REF_INT map;
  REF_DBL xyz [6] [3];
  REF_INT nodes [27];
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT cell;
  REF_SUBDIV ref_subdiv_local;
  
  pRVar1 = ref_subdiv->grid->node;
  ref_cell_00 = ref_subdiv->grid->cell[10];
  ref_cell._4_4_ = 0;
  do {
    if (ref_cell_00->max <= (int)ref_cell._4_4_) {
      return 0;
    }
    if (((-1 < (int)ref_cell._4_4_) && ((int)ref_cell._4_4_ < ref_cell_00->max)) &&
       (ref_cell_00->c2n[(int)(ref_cell_00->size_per * ref_cell._4_4_)] != -1)) {
      ref_private_macro_code_rss = ref_subdiv_map(ref_subdiv,ref_cell_00,ref_cell._4_4_);
      uVar2 = ref_cell_nodes(ref_cell_00,ref_cell._4_4_,(REF_INT *)(xyz[5] + 2));
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x988,"ref_subdiv_test_impossible_marks",(ulong)uVar2,"nodes");
        return uVar2;
      }
      if (ref_private_macro_code_rss != 0) {
        if (ref_private_macro_code_rss == 0x34) {
          _possible = pRVar1->real[xyz[5][2]._0_4_ * 0xf];
          xyz[0][0] = pRVar1->real[xyz[5][2]._0_4_ * 0xf + 1];
          xyz[0][1] = pRVar1->real[xyz[5][2]._0_4_ * 0xf + 2];
          xyz[0][2] = pRVar1->real[xyz[5][2]._4_4_ * 0xf];
          xyz[1][0] = pRVar1->real[xyz[5][2]._4_4_ * 0xf + 1];
          xyz[1][1] = pRVar1->real[xyz[5][2]._4_4_ * 0xf + 2];
          xyz[1][2] = pRVar1->real[nodes[0] * 0xf];
          xyz[2][0] = pRVar1->real[nodes[0] * 0xf + 1];
          xyz[2][1] = pRVar1->real[nodes[0] * 0xf + 2];
          xyz[2][2] = (pRVar1->real[nodes[1] * 0xf] + _possible) * 0.5;
          xyz[3][0] = (pRVar1->real[nodes[1] * 0xf + 1] + xyz[0][0]) * 0.5;
          xyz[3][1] = (pRVar1->real[nodes[1] * 0xf + 2] + xyz[0][1]) * 0.5;
          xyz[3][2] = (pRVar1->real[nodes[2] * 0xf] + xyz[0][2]) * 0.5;
          xyz[4][0] = (pRVar1->real[nodes[2] * 0xf + 1] + xyz[1][0]) * 0.5;
          xyz[4][1] = (pRVar1->real[nodes[2] * 0xf + 2] + xyz[1][1]) * 0.5;
          xyz[4][2] = (pRVar1->real[nodes[3] * 0xf] + xyz[1][2]) * 0.5;
          xyz[5][0] = (pRVar1->real[nodes[3] * 0xf + 1] + xyz[2][0]) * 0.5;
          xyz[5][1] = (pRVar1->real[nodes[3] * 0xf + 2] + xyz[2][1]) * 0.5;
          uVar2 = ref_subdiv_test_pri((REF_DBL (*) [3])&possible,&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x996,"ref_subdiv_test_impossible_marks",(ulong)uVar2,"test pri");
            return uVar2;
          }
        }
        else if (ref_private_macro_code_rss == 0x41) {
          _possible = pRVar1->real[xyz[5][2]._0_4_ * 0xf];
          xyz[0][0] = pRVar1->real[xyz[5][2]._0_4_ * 0xf + 1];
          xyz[0][1] = pRVar1->real[xyz[5][2]._0_4_ * 0xf + 2];
          xyz[1][2] = pRVar1->real[nodes[0] * 0xf];
          xyz[2][0] = pRVar1->real[nodes[0] * 0xf + 1];
          xyz[2][1] = pRVar1->real[nodes[0] * 0xf + 2];
          xyz[2][2] = pRVar1->real[nodes[1] * 0xf];
          xyz[3][0] = pRVar1->real[nodes[1] * 0xf + 1];
          xyz[3][1] = pRVar1->real[nodes[1] * 0xf + 2];
          xyz[4][2] = pRVar1->real[nodes[3] * 0xf];
          xyz[5][0] = pRVar1->real[nodes[3] * 0xf + 1];
          xyz[5][1] = pRVar1->real[nodes[3] * 0xf + 2];
          xyz[0][2] = (pRVar1->real[xyz[5][2]._4_4_ * 0xf] + _possible) * 0.5;
          xyz[1][0] = (pRVar1->real[xyz[5][2]._4_4_ * 0xf + 1] + xyz[0][0]) * 0.5;
          xyz[1][1] = (pRVar1->real[xyz[5][2]._4_4_ * 0xf + 2] + xyz[0][1]) * 0.5;
          xyz[3][2] = (pRVar1->real[nodes[2] * 0xf] + xyz[2][2]) * 0.5;
          xyz[4][0] = (pRVar1->real[nodes[2] * 0xf + 1] + xyz[3][0]) * 0.5;
          xyz[4][1] = (pRVar1->real[nodes[2] * 0xf + 2] + xyz[3][1]) * 0.5;
          uVar2 = ref_subdiv_test_pri((REF_DBL (*) [3])&possible,&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x9a1,"ref_subdiv_test_impossible_marks",(ulong)uVar2,"test pri");
            return uVar2;
          }
        }
        else if (ref_private_macro_code_rss == 0x82) {
          _possible = pRVar1->real[xyz[5][2]._0_4_ * 0xf];
          xyz[0][0] = pRVar1->real[xyz[5][2]._0_4_ * 0xf + 1];
          xyz[0][1] = pRVar1->real[xyz[5][2]._0_4_ * 0xf + 2];
          xyz[0][2] = pRVar1->real[xyz[5][2]._4_4_ * 0xf];
          xyz[1][0] = pRVar1->real[xyz[5][2]._4_4_ * 0xf + 1];
          xyz[1][1] = pRVar1->real[xyz[5][2]._4_4_ * 0xf + 2];
          xyz[2][2] = pRVar1->real[nodes[1] * 0xf];
          xyz[3][0] = pRVar1->real[nodes[1] * 0xf + 1];
          xyz[3][1] = pRVar1->real[nodes[1] * 0xf + 2];
          xyz[3][2] = pRVar1->real[nodes[2] * 0xf];
          xyz[4][0] = pRVar1->real[nodes[2] * 0xf + 1];
          xyz[4][1] = pRVar1->real[nodes[2] * 0xf + 2];
          xyz[1][2] = (pRVar1->real[nodes[0] * 0xf] + _possible) * 0.5;
          xyz[2][0] = (pRVar1->real[nodes[0] * 0xf + 1] + xyz[0][0]) * 0.5;
          xyz[2][1] = (pRVar1->real[nodes[0] * 0xf + 2] + xyz[0][1]) * 0.5;
          xyz[4][2] = (pRVar1->real[nodes[3] * 0xf] + xyz[2][2]) * 0.5;
          xyz[5][0] = (pRVar1->real[nodes[3] * 0xf + 1] + xyz[3][0]) * 0.5;
          xyz[5][1] = (pRVar1->real[nodes[3] * 0xf + 2] + xyz[3][1]) * 0.5;
          uVar2 = ref_subdiv_test_pri((REF_DBL (*) [3])&possible,&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x9ac,"ref_subdiv_test_impossible_marks",(ulong)uVar2,"test pri");
            return uVar2;
          }
        }
        else if (ref_private_macro_code_rss == 0x108) {
          _possible = pRVar1->real[xyz[5][2]._0_4_ * 0xf];
          xyz[0][0] = pRVar1->real[xyz[5][2]._0_4_ * 0xf + 1];
          xyz[0][1] = pRVar1->real[xyz[5][2]._0_4_ * 0xf + 2];
          xyz[0][2] = pRVar1->real[xyz[5][2]._4_4_ * 0xf];
          xyz[1][0] = pRVar1->real[xyz[5][2]._4_4_ * 0xf + 1];
          xyz[1][1] = pRVar1->real[xyz[5][2]._4_4_ * 0xf + 2];
          xyz[2][2] = pRVar1->real[nodes[1] * 0xf];
          xyz[3][0] = pRVar1->real[nodes[1] * 0xf + 1];
          xyz[3][1] = pRVar1->real[nodes[1] * 0xf + 2];
          xyz[3][2] = pRVar1->real[nodes[2] * 0xf];
          xyz[4][0] = pRVar1->real[nodes[2] * 0xf + 1];
          xyz[4][1] = pRVar1->real[nodes[2] * 0xf + 2];
          xyz[1][2] = (pRVar1->real[nodes[0] * 0xf] + xyz[0][2]) * 0.5;
          xyz[2][0] = (pRVar1->real[nodes[0] * 0xf + 1] + xyz[1][0]) * 0.5;
          xyz[2][1] = (pRVar1->real[nodes[0] * 0xf + 2] + xyz[1][1]) * 0.5;
          xyz[4][2] = (pRVar1->real[nodes[3] * 0xf] + xyz[3][2]) * 0.5;
          xyz[5][0] = (pRVar1->real[nodes[3] * 0xf + 1] + xyz[4][0]) * 0.5;
          xyz[5][1] = (pRVar1->real[nodes[3] * 0xf + 2] + xyz[4][1]) * 0.5;
          uVar2 = ref_subdiv_test_pri((REF_DBL (*) [3])&possible,&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x9b7,"ref_subdiv_test_impossible_marks",(ulong)uVar2,"test pri");
            return uVar2;
          }
        }
        else {
          if (ref_private_macro_code_rss != 0x1cb) {
            uVar2 = ref_subdiv_map_to_edge(ref_private_macro_code_rss);
            if (uVar2 == 0) {
              printf("pri %d, map %d\n",(ulong)ref_cell._4_4_,
                     (ulong)(uint)ref_private_macro_code_rss);
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x9e1,"ref_subdiv_test_impossible_marks",6,"map not implemented yet");
              return 6;
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x9df,"ref_subdiv_test_impossible_marks",(ulong)uVar2,"map2edge");
            return uVar2;
          }
          _possible = pRVar1->real[xyz[5][2]._0_4_ * 0xf];
          xyz[0][0] = pRVar1->real[xyz[5][2]._0_4_ * 0xf + 1];
          xyz[0][1] = pRVar1->real[xyz[5][2]._0_4_ * 0xf + 2];
          xyz[2][2] = pRVar1->real[nodes[1] * 0xf];
          xyz[3][0] = pRVar1->real[nodes[1] * 0xf + 1];
          xyz[3][1] = pRVar1->real[nodes[1] * 0xf + 2];
          xyz[0][2] = (pRVar1->real[xyz[5][2]._4_4_ * 0xf] + _possible) * 0.5;
          xyz[1][0] = (pRVar1->real[xyz[5][2]._4_4_ * 0xf + 1] + xyz[0][0]) * 0.5;
          xyz[1][1] = (pRVar1->real[xyz[5][2]._4_4_ * 0xf + 2] + xyz[0][1]) * 0.5;
          xyz[1][2] = (pRVar1->real[nodes[0] * 0xf] + _possible) * 0.5;
          xyz[2][0] = (pRVar1->real[nodes[0] * 0xf + 1] + xyz[0][0]) * 0.5;
          xyz[2][1] = (pRVar1->real[nodes[0] * 0xf + 2] + xyz[0][1]) * 0.5;
          xyz[3][2] = (pRVar1->real[nodes[2] * 0xf] + xyz[2][2]) * 0.5;
          xyz[4][0] = (pRVar1->real[nodes[2] * 0xf + 1] + xyz[3][0]) * 0.5;
          xyz[4][1] = (pRVar1->real[nodes[2] * 0xf + 2] + xyz[3][1]) * 0.5;
          xyz[4][2] = (pRVar1->real[nodes[3] * 0xf] + xyz[2][2]) * 0.5;
          xyz[5][0] = (pRVar1->real[nodes[3] * 0xf + 1] + xyz[3][0]) * 0.5;
          xyz[5][1] = (pRVar1->real[nodes[3] * 0xf + 2] + xyz[3][1]) * 0.5;
          uVar2 = ref_subdiv_test_pri((REF_DBL (*) [3])&possible,&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x9c1,"ref_subdiv_test_impossible_marks",(ulong)uVar2,"test pri");
            return uVar2;
          }
          xyz[0][2] = pRVar1->real[xyz[5][2]._4_4_ * 0xf];
          xyz[1][0] = pRVar1->real[xyz[5][2]._4_4_ * 0xf + 1];
          xyz[1][1] = pRVar1->real[xyz[5][2]._4_4_ * 0xf + 2];
          xyz[3][2] = pRVar1->real[nodes[2] * 0xf];
          xyz[4][0] = pRVar1->real[nodes[2] * 0xf + 1];
          xyz[4][1] = pRVar1->real[nodes[2] * 0xf + 2];
          _possible = (pRVar1->real[xyz[5][2]._0_4_ * 0xf] + xyz[0][2]) * 0.5;
          xyz[0][0] = (pRVar1->real[xyz[5][2]._0_4_ * 0xf + 1] + xyz[1][0]) * 0.5;
          xyz[0][1] = (pRVar1->real[xyz[5][2]._0_4_ * 0xf + 2] + xyz[1][1]) * 0.5;
          xyz[1][2] = (pRVar1->real[nodes[0] * 0xf] + xyz[0][2]) * 0.5;
          xyz[2][0] = (pRVar1->real[nodes[0] * 0xf + 1] + xyz[1][0]) * 0.5;
          xyz[2][1] = (pRVar1->real[nodes[0] * 0xf + 2] + xyz[1][1]) * 0.5;
          xyz[2][2] = (pRVar1->real[nodes[1] * 0xf] + xyz[3][2]) * 0.5;
          xyz[3][0] = (pRVar1->real[nodes[1] * 0xf + 1] + xyz[4][0]) * 0.5;
          xyz[3][1] = (pRVar1->real[nodes[1] * 0xf + 2] + xyz[4][1]) * 0.5;
          xyz[4][2] = (pRVar1->real[nodes[3] * 0xf] + xyz[3][2]) * 0.5;
          xyz[5][0] = (pRVar1->real[nodes[3] * 0xf + 1] + xyz[4][0]) * 0.5;
          xyz[5][1] = (pRVar1->real[nodes[3] * 0xf + 2] + xyz[4][1]) * 0.5;
          uVar2 = ref_subdiv_test_pri((REF_DBL (*) [3])&possible,&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x9c9,"ref_subdiv_test_impossible_marks",(ulong)uVar2,"test pri");
            return uVar2;
          }
          xyz[1][2] = pRVar1->real[nodes[0] * 0xf];
          xyz[2][0] = pRVar1->real[nodes[0] * 0xf + 1];
          xyz[2][1] = pRVar1->real[nodes[0] * 0xf + 2];
          xyz[4][2] = pRVar1->real[nodes[3] * 0xf];
          xyz[5][0] = pRVar1->real[nodes[3] * 0xf + 1];
          xyz[5][1] = pRVar1->real[nodes[3] * 0xf + 2];
          _possible = (pRVar1->real[xyz[5][2]._0_4_ * 0xf] + xyz[1][2]) * 0.5;
          xyz[0][0] = (pRVar1->real[xyz[5][2]._0_4_ * 0xf + 1] + xyz[2][0]) * 0.5;
          xyz[0][1] = (pRVar1->real[xyz[5][2]._0_4_ * 0xf + 2] + xyz[2][1]) * 0.5;
          xyz[0][2] = (pRVar1->real[xyz[5][2]._4_4_ * 0xf] + xyz[1][2]) * 0.5;
          xyz[1][0] = (pRVar1->real[xyz[5][2]._4_4_ * 0xf + 1] + xyz[2][0]) * 0.5;
          xyz[1][1] = (pRVar1->real[xyz[5][2]._4_4_ * 0xf + 2] + xyz[2][1]) * 0.5;
          xyz[2][2] = (pRVar1->real[nodes[1] * 0xf] + xyz[4][2]) * 0.5;
          xyz[3][0] = (pRVar1->real[nodes[1] * 0xf + 1] + xyz[5][0]) * 0.5;
          xyz[3][1] = (pRVar1->real[nodes[1] * 0xf + 2] + xyz[5][1]) * 0.5;
          xyz[3][2] = (pRVar1->real[nodes[2] * 0xf] + xyz[4][2]) * 0.5;
          xyz[4][0] = (pRVar1->real[nodes[2] * 0xf + 1] + xyz[5][0]) * 0.5;
          xyz[4][1] = (pRVar1->real[nodes[2] * 0xf + 2] + xyz[5][1]) * 0.5;
          uVar2 = ref_subdiv_test_pri((REF_DBL (*) [3])&possible,&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x9d1,"ref_subdiv_test_impossible_marks",(ulong)uVar2,"test pri");
            return uVar2;
          }
          _possible = (pRVar1->real[xyz[5][2]._0_4_ * 0xf] + pRVar1->real[xyz[5][2]._4_4_ * 0xf]) *
                      0.5;
          xyz[0][0] = (pRVar1->real[xyz[5][2]._0_4_ * 0xf + 1] +
                      pRVar1->real[xyz[5][2]._4_4_ * 0xf + 1]) * 0.5;
          xyz[0][1] = (pRVar1->real[xyz[5][2]._0_4_ * 0xf + 2] +
                      pRVar1->real[xyz[5][2]._4_4_ * 0xf + 2]) * 0.5;
          xyz[0][2] = (pRVar1->real[xyz[5][2]._4_4_ * 0xf] + pRVar1->real[nodes[0] * 0xf]) * 0.5;
          xyz[1][0] = (pRVar1->real[xyz[5][2]._4_4_ * 0xf + 1] + pRVar1->real[nodes[0] * 0xf + 1]) *
                      0.5;
          xyz[1][1] = (pRVar1->real[xyz[5][2]._4_4_ * 0xf + 2] + pRVar1->real[nodes[0] * 0xf + 2]) *
                      0.5;
          xyz[1][2] = (pRVar1->real[nodes[0] * 0xf] + pRVar1->real[xyz[5][2]._0_4_ * 0xf]) * 0.5;
          xyz[2][0] = (pRVar1->real[nodes[0] * 0xf + 1] + pRVar1->real[xyz[5][2]._0_4_ * 0xf + 1]) *
                      0.5;
          xyz[2][1] = (pRVar1->real[nodes[0] * 0xf + 2] + pRVar1->real[xyz[5][2]._0_4_ * 0xf + 2]) *
                      0.5;
          xyz[2][2] = (pRVar1->real[nodes[1] * 0xf] + pRVar1->real[nodes[2] * 0xf]) * 0.5;
          xyz[3][0] = (pRVar1->real[nodes[1] * 0xf + 1] + pRVar1->real[nodes[2] * 0xf + 1]) * 0.5;
          xyz[3][1] = (pRVar1->real[nodes[1] * 0xf + 2] + pRVar1->real[nodes[2] * 0xf + 2]) * 0.5;
          xyz[3][2] = (pRVar1->real[nodes[2] * 0xf] + pRVar1->real[nodes[3] * 0xf]) * 0.5;
          xyz[4][0] = (pRVar1->real[nodes[2] * 0xf + 1] + pRVar1->real[nodes[3] * 0xf + 1]) * 0.5;
          xyz[4][1] = (pRVar1->real[nodes[2] * 0xf + 2] + pRVar1->real[nodes[3] * 0xf + 2]) * 0.5;
          xyz[4][2] = (pRVar1->real[nodes[3] * 0xf] + pRVar1->real[xyz[5][2]._0_4_ * 0xf]) * 0.5;
          xyz[5][0] = (pRVar1->real[nodes[3] * 0xf + 1] + pRVar1->real[xyz[5][2]._0_4_ * 0xf + 1]) *
                      0.5;
          xyz[5][1] = (pRVar1->real[nodes[3] * 0xf + 2] + pRVar1->real[xyz[5][2]._0_4_ * 0xf + 2]) *
                      0.5;
          uVar2 = ref_subdiv_test_pri((REF_DBL (*) [3])&possible,&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x9db,"ref_subdiv_test_impossible_marks",(ulong)uVar2,"test pri");
            return uVar2;
          }
        }
      }
    }
    ref_cell._4_4_ = ref_cell._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_test_impossible_marks(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz[6][3];
  REF_INT map;
  REF_BOOL possible;
  ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));

  ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));

  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 52: /* prism split top and bottom, edges 2,4,5 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 3);
        replace_xyz0_avg(xyz, 1, 4);
        replace_xyz0_avg(xyz, 2, 5);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 3, 0);
        replace_xyz0_avg(xyz, 4, 1);
        replace_xyz0_avg(xyz, 5, 2);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 65: /* prism split edges 0, 6 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 1);
        replace_xyz0_avg(xyz, 3, 4);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 1, 0);
        replace_xyz0_avg(xyz, 4, 3);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 130: /* prism split edges 1, 7 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 2);
        replace_xyz0_avg(xyz, 3, 5);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 2, 0);
        replace_xyz0_avg(xyz, 5, 3);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 264: /* prism split edges 3, 8 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 1, 2);
        replace_xyz0_avg(xyz, 4, 5);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 2, 1);
        replace_xyz0_avg(xyz, 5, 4);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 459: /* prism split */
        /* near edge 0-3 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 1, 0);
        replace_xyz0_avg(xyz, 2, 0);
        replace_xyz0_avg(xyz, 4, 3);
        replace_xyz0_avg(xyz, 5, 3);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        /* near edge 1-4 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 1);
        replace_xyz0_avg(xyz, 2, 1);
        replace_xyz0_avg(xyz, 3, 4);
        replace_xyz0_avg(xyz, 5, 4);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        /* near edge 2-5 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 2);
        replace_xyz0_avg(xyz, 1, 2);
        replace_xyz0_avg(xyz, 3, 5);
        replace_xyz0_avg(xyz, 4, 5);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        /* center */
        fill_xyz_avg(xyz, 0, 0, 1);
        fill_xyz_avg(xyz, 1, 1, 2);
        fill_xyz_avg(xyz, 2, 2, 0);

        fill_xyz_avg(xyz, 3, 3, 4);
        fill_xyz_avg(xyz, 4, 4, 5);
        fill_xyz_avg(xyz, 5, 5, 0);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pri %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  return REF_SUCCESS;
}